

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O3

int formk_(integer *n,integer *nsub,integer *ind,integer *nenter,integer *ileave,integer *indx2,
          integer *iupdat,logical *updatd,doublereal *wn,doublereal *wn1,integer *m,doublereal *ws,
          doublereal *wy,doublereal *sy,doublereal *theta,integer *col,integer *head,integer *info)

{
  doublereal *pdVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  integer iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  doublereal *pdVar12;
  double *pdVar13;
  doublereal *pdVar14;
  long lVar15;
  uint *puVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  doublereal *pdVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  doublereal *pdVar28;
  bool bVar29;
  double dVar30;
  doublereal dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  doublereal *local_a8;
  double *local_a0;
  long local_98;
  ulong local_90;
  doublereal *local_88;
  ulong local_80;
  doublereal *local_78;
  int local_6c;
  undefined8 local_68;
  doublereal *local_60;
  uint *local_58;
  uint *local_50;
  doublereal *local_48;
  int *local_40;
  doublereal *local_38;
  
  iVar20 = *m;
  pdVar12 = (doublereal *)(long)iVar20;
  iVar9 = *n;
  local_b8 = (uint *)(long)iVar9;
  uVar24 = ~(ulong)local_b8;
  local_cc = iVar20 * 2;
  local_38 = (doublereal *)(long)(int)~local_cc;
  pdVar1 = wn1 + (long)local_38;
  local_98 = (long)(int)local_cc;
  local_60 = pdVar1;
  local_58 = (uint *)n;
  local_50 = (uint *)nenter;
  local_48 = pdVar12;
  local_40 = ileave;
  if (*updatd == 0) {
    uVar26 = (ulong)(uint)*col;
  }
  else {
    local_c8 = CONCAT44(local_c8._4_4_,iVar9);
    local_a8 = (doublereal *)ind;
    if (iVar20 < *iupdat) {
      formk_::jy = 1;
      local_c8 = CONCAT44(local_c8._4_4_,iVar9);
      if (1 < iVar20) {
        uVar11 = local_cc | 1;
        local_c0 = (uint *)nsub;
        do {
          formk_::js = *m + formk_::jy;
          local_d0 = *m - formk_::jy;
          Wcopy_((integer *)&local_d0,pdVar1 + (int)((formk_::jy + 1) * uVar11),&c__1,
                 pdVar1 + (int)(formk_::jy * uVar11),&c__1);
          local_d0 = *m - formk_::jy;
          Wcopy_((integer *)&local_d0,pdVar1 + (int)((formk_::js + 1) * uVar11),&c__1,
                 pdVar1 + (int)(formk_::js * uVar11),&c__1);
          iVar20 = *m;
          local_d0 = iVar20 - 1;
          Wcopy_((integer *)&local_d0,pdVar1 + (int)((formk_::jy + 1) * local_cc + iVar20 + 2),&c__1
                 ,pdVar1 + (int)(iVar20 + formk_::jy * local_cc + 1),&c__1);
          formk_::jy = formk_::jy + 1;
        } while (formk_::jy < (int)local_48);
        local_c8 = CONCAT44(local_c8._4_4_,*local_58);
        iVar20 = *m;
        nsub = (integer *)local_c0;
      }
    }
    uVar11 = *nsub;
    local_b0 = (ulong)uVar11;
    uVar7 = *col;
    pdVar13 = (double *)(ulong)uVar7;
    iVar20 = iVar20 + uVar7;
    iVar9 = *head;
    uVar6 = *m;
    iVar10 = (int)local_b8;
    if (0 < (int)uVar7) {
      iVar18 = iVar9 + uVar7 + -1;
      uVar7 = 0;
      if ((int)uVar6 < iVar18) {
        uVar7 = uVar6;
      }
      iVar18 = (iVar18 - uVar7) * iVar10;
      local_80 = CONCAT44(local_80._4_4_,iVar20);
      local_88 = pdVar1 + (long)pdVar13;
      local_90 = (long)pdVar13 + 1;
      local_78 = pdVar1 + iVar20;
      uVar7 = *m;
      uVar26 = 1;
      do {
        local_a0 = (double *)CONCAT44(local_a0._4_4_,uVar6);
        if ((int)uVar11 < 1) {
          dVar30 = 0.0;
        }
        else {
          dVar30 = 0.0;
          lVar22 = 0;
          do {
            iVar25 = *(int *)((long)local_a8 + lVar22 * 4);
            dVar30 = dVar30 + wy[uVar24 + (long)(iVar18 + iVar25)] *
                              wy[uVar24 + (long)(iVar25 + iVar9 * iVar10)];
            lVar22 = lVar22 + 1;
          } while ((ulong)(uVar11 + 1) - 1 != lVar22);
        }
        dVar32 = 0.0;
        dVar33 = 0.0;
        if ((int)uVar11 < (int)(uint)local_c8) {
          lVar22 = 0;
          do {
            iVar25 = *(int *)((long)local_a8 + ((int)uVar11 + lVar22) * 4);
            lVar8 = (long)(iVar25 + iVar9 * iVar10);
            dVar32 = dVar32 + wy[uVar24 + lVar8] * ws[uVar24 + (long)(iVar18 + iVar25)];
            dVar33 = dVar33 + ws[uVar24 + lVar8] * ws[uVar24 + (long)(iVar18 + iVar25)];
            lVar22 = lVar22 + 1;
          } while ((uint)local_c8 - uVar11 != (int)lVar22);
        }
        formk_::js = uVar6 + (int)uVar26;
        local_88[uVar26 * local_98] = dVar30;
        local_60[(int)(formk_::js * local_cc + iVar20)] = dVar33;
        local_78[uVar26 * local_98] = dVar32;
        iVar9 = iVar9 % (int)uVar7 + 1;
        uVar26 = uVar26 + 1;
        uVar6 = uVar7;
      } while (uVar26 != local_90);
      local_d0 = (uint)local_c8;
      pdVar13 = (double *)(ulong)(uint)*col;
      iVar9 = *head;
    }
    local_c0 = (uint *)CONCAT44(local_c0._4_4_,uVar6);
    iVar20 = (int)pdVar13;
    uVar26 = (ulong)(iVar20 - 1U);
    formk_::jy = iVar20;
    if (iVar20 < 1) {
      pdVar12 = (doublereal *)(ulong)uVar6;
    }
    else {
      iVar18 = (iVar20 - 1U) + iVar9;
      uVar7 = 0;
      if ((int)uVar6 < iVar18) {
        uVar7 = uVar6;
      }
      uVar6 = (iVar18 - uVar7) * iVar10;
      local_68 = (ulong)uVar6;
      uVar7 = *m;
      pdVar12 = (doublereal *)(ulong)uVar7;
      iVar18 = 1;
      do {
        if ((int)uVar11 < 1) {
          dVar30 = 0.0;
        }
        else {
          dVar30 = 0.0;
          lVar22 = 0;
          do {
            iVar25 = *(int *)((long)local_a8 + lVar22 * 4);
            dVar30 = dVar30 + ws[uVar24 + (long)(iVar9 * iVar10 + iVar25)] *
                              wy[uVar24 + (long)(int)(iVar25 + uVar6)];
            lVar22 = lVar22 + 1;
          } while ((ulong)(uVar11 + 1) - 1 != lVar22);
        }
        iVar9 = iVar9 % (int)uVar7 + 1;
        local_60[(int)((int)local_c0 + iVar18 + iVar20 * local_cc)] = dVar30;
        local_c0 = (uint *)CONCAT44(local_c0._4_4_,uVar7);
        bVar29 = iVar18 != iVar20;
        iVar18 = iVar18 + 1;
      } while (bVar29);
      uVar26 = (ulong)(*col - 1);
      local_d0 = uVar11;
      local_a0 = pdVar13;
    }
  }
  pdVar1 = local_38;
  lVar22 = local_98;
  uVar11 = local_cc;
  uVar7 = (uint)uVar26;
  if ((int)uVar7 < 1) {
    formk_::is = (int)pdVar12 + 1;
  }
  else {
    iVar20 = *head;
    formk_::jy = uVar7 + 1;
    local_c0 = (uint *)(ulong)(uint)formk_::jy;
    uVar6 = *m;
    pdVar14 = (doublereal *)(ulong)uVar6;
    uVar2 = *local_50;
    uVar3 = *local_58;
    iVar9 = *local_40;
    local_80 = (ulong)iVar9;
    lVar8 = 2;
    puVar16 = (uint *)0x1;
    iVar10 = iVar20;
    do {
      local_6c = (int)puVar16;
      iVar25 = (int)local_b8;
      lVar17 = 1;
      iVar18 = iVar20;
      do {
        dVar30 = 0.0;
        dVar32 = 0.0;
        dVar33 = 0.0;
        dVar34 = 0.0;
        if (0 < (int)uVar2) {
          lVar15 = 0;
          do {
            lVar23 = (long)(indx2[lVar15] + iVar10 * iVar25);
            lVar27 = (long)(indx2[lVar15] + iVar18 * iVar25);
            dVar33 = dVar33 + ws[uVar24 + lVar27] * ws[uVar24 + lVar23];
            dVar34 = dVar34 + wy[uVar24 + lVar27] * wy[uVar24 + lVar23];
            lVar15 = lVar15 + 1;
          } while ((ulong)(uVar2 + 1) - 1 != lVar15);
        }
        if (iVar9 <= (int)uVar3) {
          dVar30 = 0.0;
          dVar32 = 0.0;
          lVar15 = -1;
          do {
            lVar23 = (long)(indx2[local_80 + lVar15] + iVar10 * iVar25);
            lVar27 = (long)(indx2[local_80 + lVar15] + iVar18 * iVar25);
            dVar30 = dVar30 + ws[uVar24 + lVar27] * ws[uVar24 + lVar23];
            dVar32 = dVar32 + wy[uVar24 + lVar27] * wy[uVar24 + lVar23];
            lVar15 = lVar15 + 1;
          } while (uVar3 - iVar9 != (int)lVar15);
        }
        formk_::js = uVar6 + (int)lVar17;
        local_60[(long)((long)puVar16 + lVar17 * local_98)] =
             (dVar34 + local_60[(long)((long)puVar16 + lVar17 * local_98)]) - dVar32;
        iVar4 = formk_::js * local_cc + (int)pdVar12 + local_6c;
        local_60[iVar4] = (local_60[iVar4] - dVar33) + dVar30;
        iVar18 = iVar18 % (int)uVar6 + 1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar8);
      iVar10 = iVar10 % (int)uVar6 + 1;
      puVar16 = (uint *)((long)puVar16 + 1);
      lVar8 = lVar8 + 1;
      pdVar12 = pdVar14;
    } while (puVar16 != local_c0);
    iVar20 = *head;
    local_90 = (ulong)(int)(uVar6 + uVar7);
    iVar9 = *head;
    local_78 = (doublereal *)CONCAT44(local_78._4_4_,iVar9);
    uVar2 = *local_50;
    local_a0 = (double *)(ulong)uVar2;
    uVar3 = *local_58;
    iVar10 = *local_40;
    local_c8 = (ulong)iVar10;
    iVar18 = *m;
    local_a8 = (doublereal *)(ulong)uVar3;
    pdVar12 = (doublereal *)(long)(int)(uVar6 + 1);
    do {
      local_88 = pdVar12;
      local_80 = CONCAT44(local_80._4_4_,iVar20);
      local_b0 = (long)(int)pdVar14 - (long)iVar18;
      puVar16 = (uint *)0x1;
      iVar4 = iVar9;
      do {
        dVar30 = 0.0;
        dVar32 = 0.0;
        if (0 < (int)uVar2) {
          lVar8 = 0;
          do {
            dVar32 = dVar32 + ws[uVar24 + (long)(indx2[lVar8] + iVar20 * iVar25)] *
                              wy[uVar24 + (long)(indx2[lVar8] + iVar4 * iVar25)];
            lVar8 = lVar8 + 1;
          } while ((ulong)(uVar2 + 1) - 1 != lVar8);
        }
        if (iVar10 <= (int)uVar3) {
          dVar30 = 0.0;
          lVar8 = -1;
          do {
            dVar30 = dVar30 + ws[uVar24 + (long)(indx2[local_c8 + lVar8] + iVar20 * iVar25)] *
                              wy[uVar24 + (long)(indx2[local_c8 + lVar8] + iVar4 * iVar25)];
            lVar8 = lVar8 + 1;
          } while (uVar3 - iVar10 != (int)lVar8);
        }
        lVar8 = (long)puVar16 * local_98;
        if ((long)local_b0 < (long)puVar16) {
          local_60[(long)((long)local_88 + lVar8)] =
               (dVar32 + local_60[(long)((long)local_88 + lVar8)]) - dVar30;
        }
        else {
          local_60[(long)((long)local_88 + lVar8)] =
               (local_60[(long)((long)local_88 + lVar8)] - dVar32) + dVar30;
        }
        iVar4 = iVar4 % iVar18 + 1;
        puVar16 = (uint *)((long)puVar16 + 1);
      } while (puVar16 != local_c0);
      iVar20 = iVar20 % iVar18 + 1;
      pdVar14 = (doublereal *)((ulong)local_88 & 0xffffffff);
      pdVar12 = (doublereal *)((long)local_88 + 1U);
    } while ((long)local_88 < (long)local_90);
    formk_::is = (integer)(doublereal *)((long)local_88 + 1U);
    local_d0 = uVar7;
    local_68 = uVar26;
  }
  formk_::m2 = *m * 2;
  uVar7 = *col;
  if (0 < (int)uVar7) {
    local_78 = sy + ~(ulong)local_48;
    local_6c = (int)local_48 + 1;
    local_68 = CONCAT44(local_68._4_4_,local_cc) | 1;
    local_58 = (uint *)((ulong)uVar7 + 2);
    local_d0 = *col;
    local_90 = (ulong)local_d0;
    local_40 = (int *)(long)(int)local_d0;
    uVar6 = local_d0 + 1;
    local_80 = (ulong)uVar6;
    lVar17 = (long)(int)(-2 - local_cc);
    pdVar21 = wn + local_98 + lVar17 + 2;
    iVar20 = *m + 1;
    iVar9 = *m + (int)local_48 * iVar20 * 2;
    lVar8 = local_98 + lVar17 + 2;
    pdVar12 = wn + lVar17 + 2;
    local_48 = wn1 + local_98 + lVar17 + 1;
    local_98 = local_80 - 1;
    uVar26 = 1;
    lVar17 = 0;
    pdVar14 = local_48;
    uVar24 = (ulong)uVar7;
    pdVar13 = wn1 + lVar8;
    puVar16 = (uint *)0x2;
    local_88 = pdVar12;
    do {
      local_b8 = puVar16;
      local_a0 = pdVar13;
      local_a8 = pdVar14;
      iVar9 = iVar9 + 1;
      local_c0 = (uint *)CONCAT44(local_c0._4_4_,iVar20);
      pdVar14 = local_a8 + iVar20;
      pdVar28 = local_48 + iVar20;
      uVar7 = (uint)uVar26;
      formk_::is = (int)uVar24 + uVar7;
      local_50 = (uint *)CONCAT44(local_50._4_4_,formk_::is);
      iVar18 = local_cc * formk_::is;
      local_b0 = CONCAT44(local_b0._4_4_,iVar9);
      uVar19 = 0;
      pdVar13 = local_a0;
      iVar10 = iVar9;
      do {
        pdVar21[uVar19] = *pdVar13 / *theta;
        wn[(long)local_38 + (long)(int)(iVar18 + uVar6 + (int)uVar19)] = local_60[iVar10] * *theta;
        uVar19 = uVar19 + 1;
        iVar10 = iVar10 + local_cc;
        pdVar13 = pdVar13 + lVar22;
      } while (uVar26 != uVar19);
      if (1 < uVar26) {
        lVar8 = 0;
        do {
          *(double *)((long)pdVar12 + lVar8 + (long)iVar18 * 8) = -*pdVar28;
          lVar8 = lVar8 + 8;
          pdVar28 = pdVar28 + lVar22;
        } while (lVar17 != lVar8);
      }
      formk_::jy = uVar7;
      if ((long)uVar26 <= (long)local_40) {
        lVar8 = 0;
        do {
          local_88[iVar18 + lVar8] = *pdVar14;
          lVar8 = lVar8 + 1;
          pdVar14 = pdVar14 + lVar22;
          formk_::jy = uVar6;
        } while (local_98 != lVar8);
      }
      local_c8 = (ulong)(uint)formk_::jy;
      wn[(long)local_38 + (long)(int)((int)local_68 * uVar7)] =
           local_78[(int)(local_6c * uVar7)] +
           wn[(long)local_38 + (long)(int)((int)local_68 * uVar7)];
      uVar26 = uVar26 + 1;
      pdVar21 = pdVar21 + lVar22;
      iVar20 = iVar20 + 1;
      lVar17 = lVar17 + 8;
      local_88 = local_88 + 1;
      local_98 = local_98 + -1;
      pdVar14 = local_a8 + lVar22;
      uVar24 = local_90;
      pdVar13 = local_a0 + 1;
      puVar16 = (uint *)((long)local_b8 + 1);
    } while ((uint *)((long)local_b8 + 1) != local_58);
    formk_::js = (int)uVar19 + local_d0;
    local_38 = pdVar12;
  }
  dpofa_(wn,&formk_::m2,col,info);
  iVar5 = -1;
  if (*info == 0) {
    iVar9 = *col;
    iVar10 = iVar9 * 2;
    iVar20 = iVar9 + 1;
    formk_::js = iVar20;
    formk_::col2 = iVar10;
    if (SBORROW4(iVar9,iVar10) != 0 < iVar9) {
      do {
        formk_::js = iVar20;
        dtrsl_(wn,&formk_::m2,col,wn + (long)pdVar1 + (long)(int)(iVar20 * uVar11 | 1),&c__11,info);
        iVar20 = formk_::js + 1;
        bVar29 = SBORROW4(formk_::js,iVar10);
        iVar18 = formk_::js + iVar9 * -2;
        formk_::js = iVar20;
      } while (bVar29 != iVar18 < 0);
    }
    iVar5 = formk_::col2;
    iVar20 = *col;
    while (formk_::is = iVar20 + 1, iVar20 < iVar5) {
      formk_::js = formk_::is;
      local_d0 = formk_::col2;
      iVar20 = formk_::is;
      if (formk_::is <= formk_::col2) {
        do {
          dVar31 = Wdot_(col,wn + (long)pdVar1 + (long)(int)(iVar20 * uVar11 | 1),&c__1,
                         wn + (long)pdVar1 + (long)(int)(formk_::js * uVar11 | 1),&c__1);
          iVar20 = formk_::is;
          lVar22 = (long)(int)(formk_::js * uVar11 + formk_::is);
          wn[(long)pdVar1 + lVar22] = dVar31 + wn[(long)pdVar1 + lVar22];
          iVar9 = formk_::js + 1;
          bVar29 = formk_::js < (int)local_d0;
          formk_::js = iVar9;
        } while (bVar29);
      }
    }
    dpofa_(wn + (long)pdVar1 + (long)(int)((uVar11 | 1) * (*col + 1)),&formk_::m2,col,info);
    iVar5 = -2;
    if (*info == 0) {
      return 0;
    }
  }
  *info = iVar5;
  return 0;
}

Assistant:

int formk_(integer *n, integer *nsub, integer *ind, integer *
	nenter, integer *ileave, integer *indx2, integer *iupdat, logical *
	updatd, doublereal *wn, doublereal *wn1, integer *m, doublereal *ws, 
	doublereal *wy, doublereal *sy, doublereal *theta, integer *col, 
	integer *head, integer *info)
{
    /* System generated locals */
    integer wn_dim1, wn_offset, wn1_dim1, wn1_offset, ws_dim1, ws_offset, 
	    wy_dim1, wy_offset, sy_dim1, sy_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, k, k1, m2, is, js, iy, jy, is1, js1, col2, dend, pend;
    extern doublereal ddot_(integer *, doublereal *, integer *, doublereal *, 
	    integer *);
    static integer upcl;
    static doublereal temp1, temp2, temp3, temp4;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *), dcopy_(integer *, doublereal *, integer *, doublereal 
	    *, integer *), dtrsl_(doublereal *, integer *, integer *, 
	    doublereal *, integer *, integer *);
    static integer ipntr, jpntr, dbegin, pbegin;

/*     ************ */

/*     Subroutine formk */

/*     This subroutine forms  the LEL^T factorization of the indefinite */

/*       matrix    K = [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */
/*                                                    where E = [-I  0] */
/*                                                              [ 0  I] */
/*     The matrix K can be shown to be equal to the matrix M^[-1]N */
/*       occurring in section 5.1 of [1], as well as to the matrix */
/*       Mbar^[-1] Nbar in section 5.3. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the problem. */
/*       On exit n is unchanged. */

/*     nsub is an integer variable */
/*       On entry nsub is the number of subspace variables in free set. */
/*       On exit nsub is not changed. */

/*     ind is an integer array of dimension nsub. */
/*       On entry ind specifies the indices of subspace variables. */
/*       On exit ind is unchanged. */

/*     nenter is an integer variable. */
/*       On entry nenter is the number of variables entering the */
/*         free set. */
/*       On exit nenter is unchanged. */

/*     ileave is an integer variable. */
/*       On entry indx2(ileave),...,indx2(n) are the variables leaving */
/*         the free set. */
/*       On exit ileave is unchanged. */

/*     indx2 is an integer array of dimension n. */
/*       On entry indx2(1),...,indx2(nenter) are the variables entering */
/*         the free set, while indx2(ileave),...,indx2(n) are the */
/*         variables leaving the free set. */
/*       On exit indx2 is unchanged. */

/*     iupdat is an integer variable. */
/*       On entry iupdat is the total number of BFGS updates made so far. */
/*       On exit iupdat is unchanged. */

/*     updatd is a logical variable. */
/*       On entry 'updatd' is true if the L-BFGS matrix is updatd. */
/*       On exit 'updatd' is unchanged. */

/*     wn is a double precision array of dimension 2m x 2m. */
/*       On entry wn is unspecified. */
/*       On exit the upper triangle of wn stores the LEL^T factorization */
/*         of the 2*col x 2*col indefinite matrix */
/*                     [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */

/*     wn1 is a double precision array of dimension 2m x 2m. */
/*       On entry wn1 stores the lower triangular part of */
/*                     [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*         in the previous iteration. */
/*       On exit wn1 stores the corresponding updated matrices. */
/*       The purpose of wn1 is just to store these inner products */
/*       so they can be easily updated and inserted into wn. */

/*     m is an integer variable. */
/*       On entry m is the maximum number of variable metric corrections */
/*         used to define the limited memory matrix. */
/*       On exit m is unchanged. */

/*     ws, wy, sy, and wtyy are double precision arrays; */
/*     theta is a double precision variable; */
/*     col is an integer variable; */
/*     head is an integer variable. */
/*       On entry they store the information defining the */
/*                                          limited memory BFGS matrix: */
/*         ws(n,m) stores S, a set of s-vectors; */
/*         wy(n,m) stores Y, a set of y-vectors; */
/*         sy(m,m) stores S'Y; */
/*         wtyy(m,m) stores the Cholesky factorization */
/*                                   of (theta*S'S+LD^(-1)L') */
/*         theta is the scaling factor specifying B_0 = theta I; */
/*         col is the number of variable metric corrections stored; */
/*         head is the location of the 1st s- (or y-) vector in S (or Y). */
/*       On exit they are unchanged. */

/*     info is an integer variable. */
/*       On entry info is unspecified. */
/*       On exit info =  0 for normal return; */
/*                    = -1 when the 1st Cholesky factorization failed; */
/*                    = -2 when the 2st Cholesky factorization failed. */

/*     Subprograms called: */

/*       Linpack ... dcopy, dpofa, dtrsl. */


/*     References: */
/*       [1] R. H. Byrd, P. Lu, J. Nocedal and C. Zhu, ``A limited */
/*       memory algorithm for bound constrained optimization'', */
/*       SIAM J. Scientific Computing 16 (1995), no. 5, pp. 1190--1208. */

/*       [2] C. Zhu, R.H. Byrd, P. Lu, J. Nocedal, ``L-BFGS-B: a */
/*       limited memory FORTRAN code for solving bound constrained */
/*       optimization problems'', Tech. Report, NAM-11, EECS Department, */
/*       Northwestern University, 1994. */

/*       (Postscript files of these papers are available via anonymous */
/*        ftp to eecs.nwu.edu in the directory pub/lbfgs/lbfgs_bcm.) */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the lower triangular part of */
/*               WN1 = [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*        where L_a is the strictly lower triangular part of S'AA'Y */
/*              R_z is the upper triangular part of S'ZZ'Y. */
    /* Parameter adjustments */
    --indx2;
    --ind;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wy_dim1 = *n;
    wy_offset = 1 + wy_dim1;
    wy -= wy_offset;
    ws_dim1 = *n;
    ws_offset = 1 + ws_dim1;
    ws -= ws_offset;
    wn1_dim1 = 2 * *m;
    wn1_offset = 1 + wn1_dim1;
    wn1 -= wn1_offset;
    wn_dim1 = 2 * *m;
    wn_offset = 1 + wn_dim1;
    wn -= wn_offset;

    /* Function Body */
    if (*updatd) {
	if (*iupdat > *m) {
/*                                 shift old part of WN1. */
	    i__1 = *m - 1;
	    for (jy = 1; jy <= i__1; ++jy) {
		js = *m + jy;
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[jy + 1 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			jy + jy * wn1_dim1], &c__1);
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[js + 1 + (js + 1) * wn1_dim1], &c__1, &wn1[
			js + js * wn1_dim1], &c__1);
		i__2 = *m - 1;
		dcopy_(&i__2, &wn1[*m + 2 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			*m + 1 + jy * wn1_dim1], &c__1);
/* L10: */
	    }
	}
/*          put new rows in blocks (1,1), (2,1) and (2,2). */
	pbegin = 1;
	pend = *nsub;
	dbegin = *nsub + 1;
	dend = *n;
	iy = *col;
	is = *m + *col;
	ipntr = *head + *col - 1;
	if (ipntr > *m) {
	    ipntr -= *m;
	}
	jpntr = *head;
	i__1 = *col;
	for (jy = 1; jy <= i__1; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
/*             compute element jy of row 'col' of Y'ZZ'Y */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
/* L15: */
	    }
/*             compute elements jy of row 'col' of L_a and S'AA'S */
	    i__2 = dend;
	    for (k = dbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L16: */
	    }
	    wn1[iy + jy * wn1_dim1] = temp1;
	    wn1[is + js * wn1_dim1] = temp2;
	    wn1[is + jy * wn1_dim1] = temp3;
	    jpntr = jpntr % *m + 1;
/* L20: */
	}
/*          put new column in block (2,1). */
	jy = *col;
	jpntr = *head + *col - 1;
	if (jpntr > *m) {
	    jpntr -= *m;
	}
	ipntr = *head;
	i__1 = *col;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    is = *m + i__;
	    temp3 = 0.;
/*             compute element i of column 'col' of R_z */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L25: */
	    }
	    ipntr = ipntr % *m + 1;
	    wn1[is + jy * wn1_dim1] = temp3;
/* L30: */
	}
	upcl = *col - 1;
    } else {
	upcl = *col;
    }
/*       modify the old parts in blocks (1,1) and (2,2) due to changes */
/*       in the set of free variables. */
    ipntr = *head;
    i__1 = upcl;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *m + iy;
	jpntr = *head;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
	    temp4 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L35: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp4 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L36: */
	    }
	    wn1[iy + jy * wn1_dim1] = wn1[iy + jy * wn1_dim1] + temp1 - temp3;
	    wn1[is + js * wn1_dim1] = wn1[is + js * wn1_dim1] - temp2 + temp4;
	    jpntr = jpntr % *m + 1;
/* L40: */
	}
	ipntr = ipntr % *m + 1;
/* L45: */
    }
/*       modify the old parts in block (2,1). */
    ipntr = *head;
    i__1 = *m + upcl;
    for (is = *m + 1; is <= i__1; ++is) {
	jpntr = *head;
	i__2 = upcl;
	for (jy = 1; jy <= i__2; ++jy) {
	    temp1 = 0.;
	    temp3 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L50: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L51: */
	    }
	    if (is <= jy + *m) {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] + temp1 - 
			temp3;
	    } else {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] - temp1 + 
			temp3;
	    }
	    jpntr = jpntr % *m + 1;
/* L55: */
	}
	ipntr = ipntr % *m + 1;
/* L60: */
    }
/*     Form the upper triangle of WN = [D+Y' ZZ'Y/theta   -L_a'+R_z' ] */
/*                                     [-L_a +R_z        S'AA'S*theta] */
    m2 = *m << 1;
    i__1 = *col;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *col + iy;
	is1 = *m + iy;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *col + jy;
	    js1 = *m + jy;
	    wn[jy + iy * wn_dim1] = wn1[iy + jy * wn1_dim1] / *theta;
	    wn[js + is * wn_dim1] = wn1[is1 + js1 * wn1_dim1] * *theta;
/* L65: */
	}
	i__2 = iy - 1;
	for (jy = 1; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = -wn1[is1 + jy * wn1_dim1];
/* L66: */
	}
	i__2 = *col;
	for (jy = iy; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = wn1[is1 + jy * wn1_dim1];
/* L67: */
	}
	wn[iy + iy * wn_dim1] += sy[iy + iy * sy_dim1];
/* L70: */
    }
/*     Form the upper triangle of WN= [  LL'            L^-1(-L_a'+R_z')] */
/*                                    [(-L_a +R_z)L'^-1   S'AA'S*theta  ] */
/*        first Cholesky factor (1,1) block of wn to get LL' */
/*                          with L' stored in the upper triangle of wn. */
    dpofa_(&wn[wn_offset], &m2, col, info);
    if (*info != 0) {
	*info = -1;
	return 0;
    }
/*        then form L^-1(-L_a'+R_z') in the (1,2) block. */
    col2 = *col << 1;
    i__1 = col2;
    for (js = *col + 1; js <= i__1; ++js) {
	dtrsl_(&wn[wn_offset], &m2, col, &wn[js * wn_dim1 + 1], &c__11, info);
/* L71: */
    }
/*     Form S'AA'S*theta + (L^-1(-L_a'+R_z'))'L^-1(-L_a'+R_z') in the */
/*        upper triangle of (2,2) block of wn. */
    i__1 = col2;
    for (is = *col + 1; is <= i__1; ++is) {
	i__2 = col2;
	for (js = is; js <= i__2; ++js) {
	    wn[is + js * wn_dim1] += ddot_(col, &wn[is * wn_dim1 + 1], &c__1, 
		    &wn[js * wn_dim1 + 1], &c__1);
/* L74: */
	}
/* L72: */
    }
/*     Cholesky factorization of (2,2) block of wn. */
    dpofa_(&wn[*col + 1 + (*col + 1) * wn_dim1], &m2, col, info);
    if (*info != 0) {
	*info = -2;
	return 0;
    }
    return 0;
}